

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

void __thiscall QHostInfoCache::put(QHostInfoCache *this,QString *name,QHostInfo *info)

{
  long lVar1;
  HostInfoError HVar2;
  QHostInfo *this_00;
  QHostInfoCacheElement *in_RDI;
  long in_FS_OFFSET;
  QHostInfoCacheElement *element;
  QMutexLocker<QMutex> locker;
  QHostInfo *pQVar3;
  QHostInfoCacheElement *cost;
  QHostInfoPrivate *in_stack_ffffffffffffffd8;
  QHostInfoPrivate *in_stack_ffffffffffffffe0;
  QCache<QString,_QHostInfoCache::QHostInfoCacheElement> *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cost = in_RDI;
  HVar2 = QHostInfo::error(&in_RDI->info);
  if (HVar2 == NoError) {
    this_00 = (QHostInfo *)operator_new(0x18);
    memset(this_00,0,0x18);
    QHostInfoCacheElement::QHostInfoCacheElement(in_RDI);
    pQVar3 = this_00;
    QHostInfo::operator=(this_00,&in_RDI->info);
    memset(&stack0xffffffffffffffd8,0,0x10);
    QElapsedTimer::QElapsedTimer((QElapsedTimer *)&stack0xffffffffffffffd8);
    pQVar3[1].d_ptr = in_stack_ffffffffffffffd8;
    pQVar3[2].d_ptr = in_stack_ffffffffffffffe0;
    QElapsedTimer::start();
    this_01 = (QCache<QString,_QHostInfoCache::QHostInfoCacheElement> *)0xaaaaaaaaaaaaaaaa;
    QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)in_RDI,(QMutex *)this_00);
    QCache<QString,_QHostInfoCache::QHostInfoCacheElement>::insert
              (this_01,(QString *)in_stack_ffffffffffffffe0,
               (QHostInfoCacheElement *)in_stack_ffffffffffffffd8,(qsizetype)cost);
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHostInfoCache::put(const QString &name, const QHostInfo &info)
{
    // if the lookup failed, don't cache
    if (info.error() != QHostInfo::NoError)
        return;

    QHostInfoCacheElement* element = new QHostInfoCacheElement();
    element->info = info;
    element->age = QElapsedTimer();
    element->age.start();

    QMutexLocker locker(&this->mutex);
    cache.insert(name, element); // cache will take ownership
}